

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O0

void checkbox_draw_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  bool bVar1;
  bool interim_selected_00;
  bool active_00;
  bool key_selected_00;
  bool bVar2;
  bool box_on_left_00;
  int iVar3;
  int iVar4;
  int width_00;
  int height_00;
  int box_width_00;
  int box_height_00;
  Am_Value *pAVar5;
  ostream *poVar6;
  char *string_00;
  bool local_141;
  Am_Font local_c8;
  Am_Object local_c0;
  undefined1 local_b8 [8];
  Am_Value value;
  Am_Object obj;
  Am_String string;
  Am_Widget_Look look;
  Computed_Colors_Record color_rec;
  Am_Alignment local_74;
  Am_Alignment align;
  Am_Font font;
  bool box_on_left;
  bool want_final_selected;
  bool key_selected;
  bool active;
  bool interim_selected;
  bool selected;
  int box_height;
  int box_width;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *drawonable_local;
  Am_Object *self_local;
  
  pAVar5 = Am_Object::Get(self,100,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x65,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x66,0);
  width_00 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x67,0);
  height_00 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x188,0);
  box_width_00 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x187,0);
  box_height_00 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x172,0);
  bVar1 = Am_Value::Valid(pAVar5);
  pAVar5 = Am_Object::Get(self,0x173,0);
  interim_selected_00 = Am_Value::operator_cast_to_bool(pAVar5);
  pAVar5 = Am_Object::Get(self,0xcc,0);
  active_00 = Am_Value::operator_cast_to_bool(pAVar5);
  pAVar5 = Am_Object::Get(self,0x17c,0);
  key_selected_00 = Am_Value::operator_cast_to_bool(pAVar5);
  pAVar5 = Am_Object::Get(self,0x17b,0);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar5);
  pAVar5 = Am_Object::Get(self,0x186,0);
  box_on_left_00 = Am_Value::operator_cast_to_bool(pAVar5);
  pAVar5 = Am_Object::Get(self,0xac,0);
  Am_Font::Am_Font((Am_Font *)&stack0xffffffffffffff90,pAVar5);
  pAVar5 = Am_Object::Get(self,0x97,0);
  Am_Alignment::Am_Alignment(&local_74,pAVar5);
  pAVar5 = Am_Object::Get(self,0x1ad,0);
  Computed_Colors_Record::Computed_Colors_Record
            ((Computed_Colors_Record *)&stack0xffffffffffffff70,pAVar5);
  pAVar5 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look((Am_Widget_Look *)((long)&string.data + 4),pAVar5);
  Am_String::Am_String((Am_String *)&obj);
  Am_Object::Am_Object((Am_Object *)&value.value,(Am_Object_Data *)0x0);
  Am_Value::Am_Value((Am_Value *)local_b8);
  pAVar5 = Am_Object::Peek(self,0x1ae,0);
  Am_Value::operator=((Am_Value *)local_b8,pAVar5);
  if (local_b8._0_2_ == 0x8008) {
    Am_String::operator=((Am_String *)&obj,(Am_Value *)local_b8);
  }
  else {
    if (local_b8._0_2_ != 0xa001) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar6 = std::operator<<(poVar6,"String slot of widget ");
      poVar6 = operator<<(poVar6,self);
      poVar6 = std::operator<<(poVar6," should have string or object type, but value is ");
      poVar6 = operator<<(poVar6,(Am_Value *)local_b8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    Am_Object::operator=((Am_Object *)&value.value,(Am_Value *)local_b8);
  }
  string_00 = Am_String::operator_cast_to_char_((Am_String *)&obj);
  Am_Object::Am_Object(&local_c0,(Am_Object *)&value.value);
  local_141 = false;
  if (bVar1) {
    local_141 = bVar2;
  }
  Am_Font::Am_Font(&local_c8,(Am_Font *)&stack0xffffffffffffff90);
  Am_Draw_Button_Widget
            (iVar3 + x_offset,iVar4 + y_offset,width_00,height_00,string_00,&local_c0,
             interim_selected_00,local_141,active_00,key_selected_00,false,false,&local_c8,
             (Computed_Colors_Record *)&stack0xffffffffffffff70,string.data._4_4_,Am_CHECK_BUTTON,
             drawonable,box_width_00,box_height_00,box_on_left_00,local_74,5,false);
  Am_Font::~Am_Font(&local_c8);
  Am_Object::~Am_Object(&local_c0);
  Am_Value::~Am_Value((Am_Value *)local_b8);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  Am_String::~Am_String((Am_String *)&obj);
  Computed_Colors_Record::~Computed_Colors_Record
            ((Computed_Colors_Record *)&stack0xffffffffffffff70);
  Am_Font::~Am_Font((Am_Font *)&stack0xffffffffffffff90);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, checkbox_draw,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  int box_width = self.Get(Am_BOX_WIDTH);
  int box_height = self.Get(Am_BOX_HEIGHT);
  bool selected = self.Get(Am_SELECTED).Valid();
  bool interim_selected = self.Get(Am_INTERIM_SELECTED);
  bool active = self.Get(Am_ACTIVE);
  bool key_selected = self.Get(Am_KEY_SELECTED);
  bool want_final_selected = self.Get(Am_FINAL_FEEDBACK_WANTED);
  bool box_on_left = self.Get(Am_BOX_ON_LEFT);

  Am_Font font(self.Get(Am_FONT));
  Am_Alignment align = self.Get(Am_H_ALIGN);

  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  // now find the contents to draw in the button
  Am_String string;
  Am_Object obj = nullptr;
  Am_Value value;
  // string slot contains a formula which gets the real object based on the
  // value of the COMMAND slot
  value = self.Peek(Am_REAL_STRING_OR_OBJ);
  if (value.type == Am_STRING)
    string = value;
  else if (value.type == Am_OBJECT)
    obj = value;
  else
    Am_ERRORO("String slot of widget "
                  << self << " should have string or object type, but value is "
                  << value,
              self, Am_REAL_STRING_OR_OBJ);

  Am_Draw_Button_Widget(left, top, width, height, string, obj, interim_selected,
                        selected && want_final_selected, active, key_selected,
                        false, false, font, color_rec, look, Am_CHECK_BUTTON,
                        drawonable, box_width, box_height, box_on_left, align,
                        5);
}